

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.h
# Opt level: O0

KTXTexture2
ktx::transcode<false>(KTXTexture2 *texture,OptionsTranscodeTarget<false> *options,Reporter *report)

{
  int iVar1;
  string_view swizzle;
  string_view swizzle_00;
  string_view swizzle_01;
  string_view swizzle_02;
  bool bVar2;
  undefined4 uVar3;
  ktxTexture2 *pkVar4;
  ktx_transcode_fmt_e *pkVar5;
  ktxTexture2 *pkVar6;
  ktxTexture2 **ppkVar7;
  uint *puVar8;
  ktxTexture *pkVar9;
  ktx_uint8_t *pkVar10;
  ktx_uint8_t *pkVar11;
  char *in_RCX;
  long in_RDX;
  ImageT<unsigned_char,_4U> *in_RSI;
  ktxTexture2 *in_RDI;
  rgb8image dstImage_2;
  rg8image dstImage_1;
  r8image dstImage;
  rgba8image srcImage;
  ktx_uint8_t *dstImageData;
  ktx_uint8_t *srcImageData;
  ktx_size_t dstImageOffset;
  ktx_size_t srcImageOffset;
  uint32_t depthIndex;
  uint32_t layerIndex;
  uint32_t faceIndex;
  uint imageDepth;
  uint imageHeight;
  uint imageWidth;
  uint32_t levelIndex;
  KTXTexture2 *outputTexture;
  bool srgb;
  ktxTextureCreateInfo createInfo;
  KTXTexture2 convertedTexture;
  bool needSwizzle;
  bool needFormatConversion;
  ktx_error_code_e ret;
  char *in_stack_fffffffffffffdb8;
  ImageT<unsigned_char,_4U> *in_stack_fffffffffffffdc0;
  uint32_t h;
  Image *dst;
  uint32_t w;
  undefined4 in_stack_fffffffffffffdd0;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ImageT<unsigned_char,_4U> *this;
  char *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  KTXTexture2 *in_stack_fffffffffffffe08;
  ktxTexture2 *this_00;
  char (*in_stack_fffffffffffffe28) [37];
  undefined8 in_stack_fffffffffffffe30;
  ReturnCode return_code;
  Reporter *in_stack_fffffffffffffe38;
  long local_e8;
  long local_e0;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8 [3];
  uint local_bc [3];
  uint local_b0 [3];
  uint local_a4;
  ImageT<unsigned_char,_4U> *local_a0;
  undefined8 local_98;
  undefined1 local_79;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_40 [40];
  long local_18;
  ImageT<unsigned_char,_4U> *local_10;
  
  return_code = (ReturnCode)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  this_00 = in_RDI;
  local_40._32_8_ = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  OptionsTranscodeTarget<false>::validateTextureTranscode
            ((OptionsTranscodeTarget<false> *)in_RDI,in_stack_fffffffffffffe08,
             (Reporter *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  pkVar4 = KTXTexture2::operator_cast_to_ktxTexture2_((KTXTexture2 *)local_10);
  pkVar5 = std::optional<ktx_transcode_fmt_e>::value
                     ((optional<ktx_transcode_fmt_e> *)in_stack_fffffffffffffdc0);
  local_40._28_4_ = ktxTexture2_TranscodeBasis(pkVar4,*pkVar5,0);
  if (local_40._28_4_ != 0) {
    local_40._16_8_ = ktxErrorString(local_40._28_4_);
    Reporter::fatal<char_const(&)[37],char_const*>
              (in_stack_fffffffffffffe38,return_code,in_stack_fffffffffffffe28,(char **)pkVar4);
  }
  local_40[0xf] = 0;
  local_40[0xe] = 0;
  if (*(int *)(local_18 + 0x28) != 0) {
    if (*(int *)(local_18 + 0x28) == 4) {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      if (bVar2) {
        local_40[0xe] = 1;
      }
    }
    else {
      local_40[0xf] = 1;
      local_40[0xe] = 1;
    }
  }
  KTXTexture2::KTXTexture2((KTXTexture2 *)local_40,(nullptr_t)0x0);
  if ((local_40[0xf] & 1) != 0) {
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
    local_79 = pkVar6->vkFormat == 0x2b;
    iVar1 = *(int *)(local_18 + 0x28);
    if (iVar1 == 1) {
      uVar3 = 9;
      if ((bool)local_79) {
        uVar3 = 0xf;
      }
      local_78 = CONCAT44(uVar3,(undefined4)local_78);
    }
    else if (iVar1 == 2) {
      uVar3 = 0x10;
      if ((bool)local_79) {
        uVar3 = 0x16;
      }
      local_78 = CONCAT44(uVar3,(undefined4)local_78);
    }
    else {
      if (iVar1 != 3) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                      ,0x7d,
                      "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = false]"
                     );
      }
      uVar3 = 0x17;
      if ((bool)local_79) {
        uVar3 = 0x1d;
      }
      local_78 = CONCAT44(uVar3,(undefined4)local_78);
    }
    pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
    local_68 = CONCAT44(local_68._4_4_,pkVar6->baseWidth);
    pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
    local_68 = CONCAT44(pkVar6->baseHeight,(undefined4)local_68);
    pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
    uStack_60 = CONCAT44(uStack_60._4_4_,pkVar6->baseDepth);
    pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
    uStack_50 = CONCAT26(uStack_50._6_2_,CONCAT15(pkVar6->generateMipmaps,(undefined5)uStack_50)) &
                0xffff01ffffffffff;
    pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
    uStack_50 = CONCAT35(uStack_50._5_3_,CONCAT14(pkVar6->isArray,(undefined4)uStack_50)) &
                0xffffff01ffffffff;
    pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
    uStack_60 = CONCAT44(pkVar6->numDimensions,(undefined4)uStack_60);
    pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
    uStack_50 = CONCAT44(uStack_50._4_4_,pkVar6->numFaces);
    pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
    local_58._4_4_ = pkVar6->numLayers;
    pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
    local_58 = CONCAT44(local_58._4_4_,pkVar6->numLevels);
    uStack_70 = 0;
    ppkVar7 = KTXTexture2::pHandle((KTXTexture2 *)local_40);
    local_40._28_4_ = ktxTexture2_Create(&local_78,1,ppkVar7);
    if (local_40._28_4_ != 0) {
      local_98 = ktxErrorString(local_40._28_4_);
      Reporter::fatal<char_const(&)[36],char_const*>
                (in_stack_fffffffffffffe38,return_code,(char (*) [36])in_stack_fffffffffffffe28,
                 (char **)pkVar4);
      in_stack_fffffffffffffdf0 = (char *)local_40._32_8_;
    }
  }
  pkVar4 = KTXTexture2::handle((KTXTexture2 *)local_40);
  this = local_10;
  if (pkVar4 != (ktxTexture2 *)0x0) {
    this = (ImageT<unsigned_char,_4U> *)local_40;
  }
  local_a0 = this;
  if (((local_40[0xf] & 1) != 0) || ((local_40[0xe] & 1) != 0)) {
    local_a4 = 0;
    while (uVar14 = local_a4, pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10),
          uVar14 < pkVar6->numLevels) {
      local_b0[1] = 1;
      pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
      local_b0[0] = pkVar6->baseWidth >> ((byte)local_a4 & 0x1f);
      puVar8 = std::max<unsigned_int>(local_b0 + 1,local_b0);
      local_b0[2] = *puVar8;
      local_bc[1] = 1;
      pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
      local_bc[0] = pkVar6->baseHeight >> ((byte)local_a4 & 0x1f);
      puVar8 = std::max<unsigned_int>(local_bc + 1,local_bc);
      local_bc[2] = *puVar8;
      local_c8[1] = 1;
      pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
      local_c8[0] = pkVar6->baseDepth >> ((byte)local_a4 & 0x1f);
      puVar8 = std::max<unsigned_int>(local_c8 + 1,local_c8);
      local_c8[2] = *puVar8;
      local_cc = 0;
      while (uVar13 = local_cc, pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10),
            uVar13 < pkVar6->numFaces) {
        local_d0 = 0;
        while (uVar12 = local_d0, pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10),
              uVar12 < pkVar6->numLayers) {
          for (local_d4 = 0; local_d4 < local_c8[2]; local_d4 = local_d4 + 1) {
            pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
            dst = (Image *)pkVar6->vtbl->GetImageOffset;
            pkVar9 = KTXTexture2::operator_cast_to_ktxTexture_((KTXTexture2 *)local_10);
            (*(code *)dst)(pkVar9,local_a4,local_d0,local_cc + local_d4,&local_e0);
            pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_a0);
            in_stack_fffffffffffffdc0 = (ImageT<unsigned_char,_4U> *)pkVar6->vtbl->GetImageOffset;
            pkVar9 = KTXTexture2::operator_cast_to_ktxTexture_((KTXTexture2 *)local_a0);
            (*(code *)in_stack_fffffffffffffdc0)
                      (pkVar9,local_a4,local_d0,local_cc + local_d4,&local_e8);
            pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_10);
            pkVar10 = pkVar6->pData + local_e0;
            pkVar6 = KTXTexture2::operator->((KTXTexture2 *)local_a0);
            pkVar11 = pkVar6->pData + local_e8;
            ImageT<unsigned_char,_4U>::ImageT
                      ((ImageT<unsigned_char,_4U> *)CONCAT44(uVar12,in_stack_fffffffffffffdd0),
                       (uint32_t)((ulong)dst >> 0x20),(uint32_t)dst,
                       (Color *)in_stack_fffffffffffffdc0);
            h = (uint32_t)dst;
            w = (uint32_t)((ulong)dst >> 0x20);
            switch(*(undefined4 *)(local_18 + 0x28)) {
            case 1:
              ImageT<unsigned_char,_1U>::ImageT
                        ((ImageT<unsigned_char,_1U> *)CONCAT44(uVar12,in_stack_fffffffffffffdd0),w,h
                         ,(Color *)in_stack_fffffffffffffdc0);
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_18 + 0x30));
              swizzle._M_len._4_4_ = uVar14;
              swizzle._M_len._0_4_ = uVar13;
              swizzle._M_str = (char *)this;
              ImageT<unsigned_char,_4U>::copyToR
                        ((ImageT<unsigned_char,_4U> *)CONCAT44(uVar12,in_stack_fffffffffffffdd0),dst
                         ,swizzle);
              ImageT<unsigned_char,_1U>::~ImageT
                        ((ImageT<unsigned_char,_1U> *)in_stack_fffffffffffffdc0);
              break;
            case 2:
              ImageT<unsigned_char,_2U>::ImageT
                        ((ImageT<unsigned_char,_2U> *)CONCAT44(uVar12,in_stack_fffffffffffffdd0),w,h
                         ,(Color *)in_stack_fffffffffffffdc0);
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_18 + 0x30));
              swizzle_00._M_len._4_4_ = uVar14;
              swizzle_00._M_len._0_4_ = uVar13;
              swizzle_00._M_str = (char *)this;
              ImageT<unsigned_char,_4U>::copyToRG
                        ((ImageT<unsigned_char,_4U> *)CONCAT44(uVar12,in_stack_fffffffffffffdd0),dst
                         ,swizzle_00);
              ImageT<unsigned_char,_2U>::~ImageT
                        ((ImageT<unsigned_char,_2U> *)in_stack_fffffffffffffdc0);
              break;
            case 3:
              ImageT<unsigned_char,_3U>::ImageT
                        ((ImageT<unsigned_char,_3U> *)CONCAT44(uVar12,in_stack_fffffffffffffdd0),w,h
                         ,(Color *)in_stack_fffffffffffffdc0);
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_18 + 0x30));
              swizzle_01._M_len._4_4_ = uVar14;
              swizzle_01._M_len._0_4_ = uVar13;
              swizzle_01._M_str = (char *)this;
              ImageT<unsigned_char,_4U>::copyToRGB
                        ((ImageT<unsigned_char,_4U> *)CONCAT44(uVar12,in_stack_fffffffffffffdd0),dst
                         ,swizzle_01);
              ImageT<unsigned_char,_3U>::~ImageT
                        ((ImageT<unsigned_char,_3U> *)in_stack_fffffffffffffdc0);
              break;
            case 4:
              if (pkVar10 != pkVar11) {
                __assert_fail("srcImageData == dstImageData",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                              ,0xb6,
                              "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = false]"
                             );
              }
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_18 + 0x30));
              swizzle_02._M_str = in_stack_fffffffffffffdf0;
              swizzle_02._M_len = (size_t)pkVar4;
              ImageT<unsigned_char,_4U>::swizzle(this,swizzle_02);
              break;
            default:
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                            ,0xbb,
                            "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = false]"
                           );
            }
            ImageT<unsigned_char,_4U>::~ImageT(in_stack_fffffffffffffdc0);
          }
          local_d0 = local_d0 + 1;
        }
        local_cc = local_cc + 1;
      }
      local_a4 = local_a4 + 1;
    }
  }
  KTXTexture2::KTXTexture2((KTXTexture2 *)this_00,(KTXTexture2 *)local_a0);
  KTXTexture2::~KTXTexture2((KTXTexture2 *)in_stack_fffffffffffffdc0);
  return (KTXTexture2)in_RDI;
}

Assistant:

KTXTexture2 transcode(KTXTexture2&& texture, OptionsTranscodeTarget<TRANSCODE_CMD>& options, Reporter& report) {
    options.validateTextureTranscode(texture, report);

    auto ret = ktxTexture2_TranscodeBasis(texture, options.transcodeTarget.value(), 0);
    if (ret != KTX_SUCCESS)
        report.fatal(rc::INVALID_FILE, "Failed to transcode KTX2 texture: {}", ktxErrorString(ret));

    // Need to perform format conversion and swizzling if needed
    bool needFormatConversion = false;
    bool needSwizzle = false;
    if (options.transcodeSwizzleComponents != 0) {
        if (options.transcodeSwizzleComponents == 4) {
            if (options.transcodeSwizzle != "rgba") {
                needSwizzle = true;
            }
        } else {
            needFormatConversion = true;
            needSwizzle = true;
        }
    }

    KTXTexture2 convertedTexture{nullptr};
    if (needFormatConversion) {
        ktxTextureCreateInfo createInfo;
        std::memset(&createInfo, 0, sizeof(createInfo));

        const bool srgb = (texture->vkFormat == VK_FORMAT_R8G8B8A8_SRGB);
        switch (options.transcodeSwizzleComponents) {
        case 1:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8_SRGB : VK_FORMAT_R8_UNORM;
            break;
        case 2:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8G8_SRGB : VK_FORMAT_R8G8_UNORM;
            break;
        case 3:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8G8B8_SRGB : VK_FORMAT_R8G8B8_UNORM;
            break;
        default:
            assert(false);
        }

        createInfo.baseWidth = texture->baseWidth;
        createInfo.baseHeight = texture->baseHeight;
        createInfo.baseDepth = texture->baseDepth;
        createInfo.generateMipmaps = texture->generateMipmaps;
        createInfo.isArray = texture->isArray;
        createInfo.numDimensions = texture->numDimensions;
        createInfo.numFaces = texture->numFaces;
        createInfo.numLayers = texture->numLayers;
        createInfo.numLevels = texture->numLevels;
        createInfo.pDfd = nullptr;

        ret = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE, convertedTexture.pHandle());
        if (KTX_SUCCESS != ret)
            report.fatal(rc::IO_FAILURE, "Failed to create output texture: {}", ktxErrorString(ret));
    }

    KTXTexture2& outputTexture = (convertedTexture.handle() != nullptr) ? convertedTexture : texture;
    if (needFormatConversion || needSwizzle) {
        for (uint32_t levelIndex = 0; levelIndex < texture->numLevels; ++levelIndex) {
            const auto imageWidth = std::max(1u, texture->baseWidth >> levelIndex);
            const auto imageHeight = std::max(1u, texture->baseHeight >> levelIndex);
            const auto imageDepth = std::max(1u, texture->baseDepth >> levelIndex);

            for (uint32_t faceIndex = 0; faceIndex < texture->numFaces; ++faceIndex) {
                for (uint32_t layerIndex = 0; layerIndex < texture->numLayers; ++layerIndex) {
                    for (uint32_t depthIndex = 0; depthIndex < imageDepth; ++depthIndex) {
                        ktx_size_t srcImageOffset;
                        ktxTexture_GetImageOffset(texture, levelIndex, layerIndex, faceIndex + depthIndex, &srcImageOffset);
                        ktx_size_t dstImageOffset;
                        ktxTexture_GetImageOffset(outputTexture, levelIndex, layerIndex, faceIndex + depthIndex, &dstImageOffset);

                        auto srcImageData = texture->pData + srcImageOffset;
                        auto dstImageData = outputTexture->pData + dstImageOffset;

                        rgba8image srcImage(imageWidth, imageHeight, reinterpret_cast<rgba8color*>(srcImageData));

                        switch (options.transcodeSwizzleComponents) {
                        case 1: {
                            r8image dstImage(imageWidth, imageHeight, reinterpret_cast<r8color*>(dstImageData));
                            srcImage.copyToR(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 2: {
                            rg8image dstImage(imageWidth, imageHeight, reinterpret_cast<rg8color*>(dstImageData));
                            srcImage.copyToRG(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 3: {
                            rgb8image dstImage(imageWidth, imageHeight, reinterpret_cast<rgb8color*>(dstImageData));
                            srcImage.copyToRGB(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 4: {
                            // Swizzle in-place
                            assert(srcImageData == dstImageData);
                            srcImage.swizzle(options.transcodeSwizzle);
                            break;
                        }
                        default:
                            assert(false);
                        }
                    }
                }
            }
        }
    }

    return std::move(outputTexture);
}